

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayout::setColumnStretch(QGridLayout *this,int column,int stretch)

{
  QGridLayoutPrivate::setColStretch
            (*(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8,column,stretch);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QGridLayout::setColumnStretch(int column, int stretch)
{
    Q_D(QGridLayout);
    d->setColStretch(column, stretch);
    invalidate();
}